

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitGetLocal(WasmBytecodeGenerator *this)

{
  uint uVar1;
  WasmLocal WVar2;
  OpCodeAsmJs OVar3;
  uint32 uVar4;
  RegSlot RVar5;
  WasmBinaryReader *pWVar6;
  WasmRegisterSpace *this_00;
  WasmCompilationException *this_01;
  
  pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar6 == (WasmBinaryReader *)0x0) {
    pWVar6 = (this->m_module->m_reader).ptr;
  }
  uVar1 = (pWVar6->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  uVar4 = WasmFunctionInfo::GetLocalCount(this->m_funcInfo);
  if (uVar1 < uVar4) {
    WVar2 = this->m_locals[uVar1];
    OVar3 = GetLoadOp(this,WVar2.type);
    this_00 = GetRegisterSpace(this,WVar2.type);
    RVar5 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)OVar3,(ulong)RVar5,(ulong)WVar2 & 0xffffffff);
    return (EmitInfo)((ulong)RVar5 | (ulong)WVar2 & 0xffffffff00000000);
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"%u is not a valid local",(ulong)uVar1);
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitGetLocal()
{
    uint32 localIndex = GetReader()->m_currentNode.var.num;
    if (m_funcInfo->GetLocalCount() <= localIndex)
    {
        throw WasmCompilationException(_u("%u is not a valid local"), localIndex);
    }

    WasmLocal local = m_locals[localIndex];

    Js::OpCodeAsmJs op = GetLoadOp(local.type);
    WasmRegisterSpace* regSpace = GetRegisterSpace(local.type);

    Js::RegSlot tmpReg = regSpace->AcquireTmpRegister();

    m_writer->AsmReg2(op, tmpReg, local.location);

    return EmitInfo(tmpReg, local.type);
}